

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

void Vec_VecPush(Vec_Vec_t *p,int Level,void *Entry)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  if (p->nSize <= Level) {
    Vec_PtrGrow((Vec_Ptr_t *)p,Level + 1);
    for (lVar2 = (long)p->nSize; lVar2 <= Level; lVar2 = lVar2 + 1) {
      pVVar1 = Vec_PtrAlloc(0);
      p->pArray[lVar2] = pVVar1;
    }
    p->nSize = Level + 1;
  }
  pVVar1 = Vec_VecEntry(p,Level);
  Vec_PtrPush(pVVar1,Entry);
  return;
}

Assistant:

static inline void Vec_VecPush( Vec_Vec_t * p, int Level, void * Entry )
{
    if ( p->nSize < Level + 1 )
    {
        int i;
        Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
        for ( i = p->nSize; i < Level + 1; i++ )
            p->pArray[i] = Vec_PtrAlloc( 0 );
        p->nSize = Level + 1;
    }
    Vec_PtrPush( Vec_VecEntry(p, Level), Entry );
}